

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall hwnet::util::TimerMgr::pop(TimerMgr *this)

{
  Timer *pTVar1;
  size_t sVar2;
  __shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (this->elements_size != 0) {
    pTVar1 = *(this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    swap(this,1,this->elements_size);
    pTVar1->mMgr = (TimerMgr *)0x0;
    pTVar1->mIndex = 0;
    local_38._M_ptr = (element_type *)0x0;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pTVar1->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>
               ,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    sVar2 = this->elements_size;
    (this->elements).super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[sVar2 - 1] = (Timer *)0x0;
    this->elements_size = sVar2 - 1;
    down(this,1);
  }
  return;
}

Assistant:

void pop() {
		if(this->elements_size > 0) {
			auto e = this->elements[0];
			this->swap(1,this->elements_size);
			e->mIndex = 0;
			e->mMgr  = nullptr;		
			e->selfPtr = nullptr;	
			this->elements[this->elements_size-1] = nullptr;
			--this->elements_size;
			this->down(1);
		}
	}